

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
booster::locale::dgettext<char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,char *domain,char *id,locale *loc)

{
  allocator local_b1;
  string local_b0;
  basic_message<char> local_90;
  
  local_90.id_._M_dataplus._M_p = (pointer)&local_90.id_.field_2;
  local_90.n_ = 0;
  local_90.c_context_ = (char_type *)0x0;
  local_90.c_plural_ = (char_type *)0x0;
  local_90.id_._M_string_length = 0;
  local_90.id_.field_2._M_local_buf[0] = '\0';
  local_90.context_._M_dataplus._M_p = (pointer)&local_90.context_.field_2;
  local_90.context_._M_string_length = 0;
  local_90.context_.field_2._M_local_buf[0] = '\0';
  local_90.plural_._M_dataplus._M_p = (pointer)&local_90.plural_.field_2;
  local_90.plural_._M_string_length = 0;
  local_90.plural_.field_2._M_local_buf[0] = '\0';
  local_90.c_id_ = id;
  std::__cxx11::string::string((string *)&local_b0,domain,&local_b1);
  basic_message<char>::str(__return_storage_ptr__,&local_90,loc,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  basic_message<char>::~basic_message(&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharType>  dgettext(  char const *domain,
                                                CharType const *id,
                                                std::locale const &loc=std::locale())
        {
            return basic_message<CharType>(id).str(loc,domain);
        }